

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O0

uint32_t * get_v7m_sp_ptr(CPUARMState_conflict *env,_Bool secure,_Bool threadmode,_Bool spsel)

{
  _Bool _Var1;
  byte local_1d;
  _Bool want_psp;
  _Bool spsel_local;
  _Bool threadmode_local;
  _Bool secure_local;
  CPUARMState_conflict *env_local;
  
  local_1d = 0;
  if (threadmode) {
    local_1d = spsel;
  }
  if ((uint)secure == (env->v7m).secure) {
    _Var1 = v7m_using_psp(env);
    if ((_Bool)(local_1d & 1) == _Var1) {
      env_local = (CPUARMState_conflict *)(env->regs + 0xd);
    }
    else {
      env_local = (CPUARMState_conflict *)&env->v7m;
    }
  }
  else if ((_Bool)(local_1d & 1) == false) {
    env_local = (CPUARMState_conflict *)&(env->v7m).other_ss_msp;
  }
  else {
    env_local = (CPUARMState_conflict *)&(env->v7m).other_ss_psp;
  }
  return env_local->regs;
}

Assistant:

static uint32_t *get_v7m_sp_ptr(CPUARMState *env, bool secure, bool threadmode,
                                bool spsel)
{
    /*
     * Return a pointer to the location where we currently store the
     * stack pointer for the requested security state and thread mode.
     * This pointer will become invalid if the CPU state is updated
     * such that the stack pointers are switched around (eg changing
     * the SPSEL control bit).
     * Compare the v8M ARM ARM pseudocode LookUpSP_with_security_mode().
     * Unlike that pseudocode, we require the caller to pass us in the
     * SPSEL control bit value; this is because we also use this
     * function in handling of pushing of the callee-saves registers
     * part of the v8M stack frame (pseudocode PushCalleeStack()),
     * and in the tailchain codepath the SPSEL bit comes from the exception
     * return magic LR value from the previous exception. The pseudocode
     * opencodes the stack-selection in PushCalleeStack(), but we prefer
     * to make this utility function generic enough to do the job.
     */
    bool want_psp = threadmode && spsel;

    if (secure == env->v7m.secure) {
        if (want_psp == v7m_using_psp(env)) {
            return &env->regs[13];
        } else {
            return &env->v7m.other_sp;
        }
    } else {
        if (want_psp) {
            return &env->v7m.other_ss_psp;
        } else {
            return &env->v7m.other_ss_msp;
        }
    }
}